

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptMap>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptMap> *this)

{
  Type *this_00;
  bool bVar1;
  Iterator iterator;
  
  VarTo<Js::JavascriptMap>(this->instance);
  JavascriptMap::GetIterator((JavascriptMap *)&stack0xffffffffffffffb8);
  this_00 = &iterator.current;
  while( true ) {
    bVar1 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            ::Iterator::Next((Iterator *)&stack0xffffffffffffffb8);
    if (!bVar1) break;
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               this_00);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               this_00);
    JsUtil::
    List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this->propertyList,
          (RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptMap> *)this_00);
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptMap>::GetChildren()
    {
        JavascriptMap* data = VarTo<JavascriptMap>(instance);
        auto iterator = data->GetIterator();
        while (iterator.Next())
        {
            Var key = iterator.Current().Key();
            Var value = iterator.Current().Value();
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptMap>(key, value));
        }
    }